

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TilesBoard.cpp
# Opt level: O0

void __thiscall
TilesBoard::createTiles(TilesBoard *this,size_t boardSize,size_t tileSize,QMainWindow *window)

{
  QWidget *pQVar1;
  QLayout *pQVar2;
  size_t sVar3;
  QHBoxLayout *this_00;
  reference ppQVar4;
  pointer pQVar5;
  QFlags<Qt::AlignmentFlag> local_dc;
  code *local_d8;
  undefined8 local_d0;
  function<void_()> local_c8;
  Object local_a8 [8];
  QString local_a0;
  QString local_88;
  QString local_70;
  unique_ptr<QPushButton,_std::default_delete<QPushButton>_> local_58;
  __single_object tile;
  size_t col;
  QHBoxLayout *local_38;
  ulong local_30;
  size_t row;
  QMainWindow *window_local;
  size_t tileSize_local;
  size_t boardSize_local;
  TilesBoard *this_local;
  
  row = (size_t)window;
  window_local = (QMainWindow *)tileSize;
  tileSize_local = boardSize;
  boardSize_local = (size_t)this;
  deleteTiles(this);
  QBoxLayout::addStretch((int)this->verticalLayout);
  for (local_30 = 0; local_30 < tileSize_local; local_30 = local_30 + 1) {
    this_00 = (QHBoxLayout *)operator_new(0x20);
    QHBoxLayout::QHBoxLayout(this_00);
    local_38 = this_00;
    std::vector<QHBoxLayout*,std::allocator<QHBoxLayout*>>::emplace_back<QHBoxLayout*>
              ((vector<QHBoxLayout*,std::allocator<QHBoxLayout*>> *)&this->horizontalLayouts,
               &local_38);
    ppQVar4 = std::vector<QHBoxLayout_*,_std::allocator<QHBoxLayout_*>_>::operator[]
                        (&this->horizontalLayouts,local_30);
    (**(code **)(*(long *)*ppQVar4 + 0x68))(*ppQVar4,0);
    ppQVar4 = std::vector<QHBoxLayout_*,_std::allocator<QHBoxLayout_*>_>::operator[]
                        (&this->horizontalLayouts,local_30);
    QBoxLayout::addStretch((int)*ppQVar4);
    for (tile._M_t.super___uniq_ptr_impl<QPushButton,_std::default_delete<QPushButton>_>._M_t.
         super__Tuple_impl<0UL,_QPushButton_*,_std::default_delete<QPushButton>_>.
         super__Head_base<0UL,_QPushButton_*,_false>._M_head_impl =
              (__uniq_ptr_data<QPushButton,_std::default_delete<QPushButton>,_true,_true>)
              (__uniq_ptr_impl<QPushButton,_std::default_delete<QPushButton>_>)0x0;
        (ulong)tile._M_t.super___uniq_ptr_impl<QPushButton,_std::default_delete<QPushButton>_>._M_t.
               super__Tuple_impl<0UL,_QPushButton_*,_std::default_delete<QPushButton>_>.
               super__Head_base<0UL,_QPushButton_*,_false>._M_head_impl < tileSize_local;
        tile._M_t.super___uniq_ptr_impl<QPushButton,_std::default_delete<QPushButton>_>._M_t.
        super__Tuple_impl<0UL,_QPushButton_*,_std::default_delete<QPushButton>_>.
        super__Head_base<0UL,_QPushButton_*,_false>._M_head_impl =
             (__uniq_ptr_data<QPushButton,_std::default_delete<QPushButton>,_true,_true>)
             ((long)tile._M_t.super___uniq_ptr_impl<QPushButton,_std::default_delete<QPushButton>_>.
                    _M_t.super__Tuple_impl<0UL,_QPushButton_*,_std::default_delete<QPushButton>_>.
                    super__Head_base<0UL,_QPushButton_*,_false>._M_head_impl + 1)) {
      std::make_unique<QPushButton>();
      pQVar5 = std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>::operator->
                         (&local_58);
      QString::number((ulong)&local_88,(int)local_30);
      QString::number((ulong)&local_a0,
                      (int)tile._M_t.
                           super___uniq_ptr_impl<QPushButton,_std::default_delete<QPushButton>_>.
                           _M_t.
                           super__Tuple_impl<0UL,_QPushButton_*,_std::default_delete<QPushButton>_>.
                           super__Head_base<0UL,_QPushButton_*,_false>._M_head_impl);
      operator+(&local_70,&local_88,&local_a0);
      QWidget::setAccessibleName((QString *)pQVar5);
      QString::~QString(&local_70);
      QString::~QString(&local_a0);
      QString::~QString(&local_88);
      pQVar5 = std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>::operator->
                         (&local_58);
      QWidget::setMaximumSize((int)pQVar5,(int)window_local);
      pQVar5 = std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>::operator->
                         (&local_58);
      QWidget::setMinimumSize((int)pQVar5,(int)window_local);
      pQVar5 = std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>::get(&local_58);
      sVar3 = row;
      std::function<void_()>::function(&local_c8,&this->pressTileSlot);
      local_d8 = QAbstractButton::clicked;
      local_d0 = 0;
      QObject::connect<void(QAbstractButton::*)(bool),std::function<void()>>
                (local_a8,(offset_in_QAbstractButton_to_subr)pQVar5,
                 (QObject *)QAbstractButton::clicked,(function<void_()> *)0x0,(ConnectionType)sVar3)
      ;
      QMetaObject::Connection::~Connection((Connection *)local_a8);
      std::function<void_()>::~function(&local_c8);
      ppQVar4 = std::vector<QHBoxLayout_*,_std::allocator<QHBoxLayout_*>_>::operator[]
                          (&this->horizontalLayouts,local_30);
      pQVar1 = (QWidget *)*ppQVar4;
      pQVar5 = std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>::get(&local_58);
      QFlags<Qt::AlignmentFlag>::QFlags(&local_dc);
      QBoxLayout::addWidget(pQVar1,(int)pQVar5,(QFlags_conflict *)0x0);
      std::
      vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
      ::push_back(&this->tiles,&local_58);
      std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>::~unique_ptr(&local_58);
    }
    ppQVar4 = std::vector<QHBoxLayout_*,_std::allocator<QHBoxLayout_*>_>::operator[]
                        (&this->horizontalLayouts,local_30);
    QBoxLayout::addStretch((int)*ppQVar4);
    pQVar2 = (QLayout *)this->verticalLayout;
    ppQVar4 = std::vector<QHBoxLayout_*,_std::allocator<QHBoxLayout_*>_>::operator[]
                        (&this->horizontalLayouts,local_30);
    QBoxLayout::addLayout(pQVar2,(int)*ppQVar4);
  }
  QBoxLayout::addStretch((int)this->verticalLayout);
  return;
}

Assistant:

void TilesBoard::createTiles( size_t boardSize, size_t tileSize, QMainWindow* window )
{
    deleteTiles();
    verticalLayout->addStretch();

    for ( size_t row = 0; row < boardSize; row++ )
    {
        horizontalLayouts.emplace_back( new QHBoxLayout() );
        horizontalLayouts[row]->setSpacing(0);
        horizontalLayouts[row]->addStretch();

        for ( size_t col = 0; col < boardSize; col++ )
        {
            auto tile = std::make_unique<QPushButton>();
            tile->setAccessibleName( QString::number( row ) + QString::number( col ));
            tile->setMaximumSize( tileSize, tileSize );
            tile->setMinimumSize( tileSize, tileSize );
            QObject::connect( tile.get(), &QPushButton::clicked, window, pressTileSlot );
            horizontalLayouts[row]->addWidget( tile.get() );
            tiles.push_back( std::move( tile ));
        }

        horizontalLayouts[row]->addStretch();
        verticalLayout->addLayout( horizontalLayouts[row] );
    }
    verticalLayout->addStretch();
}